

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ReportWarning
          (ParserImpl *this,int line,int col,string_view message)

{
  ErrorCollector *pEVar1;
  char *pcVar2;
  LogEveryPow2State LVar3;
  bool bVar4;
  LogMessage *pLVar5;
  string_view v;
  string_view v_00;
  LogMessage local_40;
  
  pEVar1 = this->error_collector_;
  if (pEVar1 != (ErrorCollector *)0x0) {
    (*pEVar1->_vptr_ErrorCollector[3])
              (pEVar1,(ulong)(uint)line,(ulong)(uint)col,message._M_len,message._M_str);
    return;
  }
  if (line < 0) {
    bVar4 = absl::lts_20250127::log_internal::LogEveryPow2State::ShouldLog
                      (&ReportWarning(int,int,std::basic_string_view<char,std::char_traits<char>>)::
                        absl_log_internal_stateful_condition_state);
    LVar3 = ReportWarning(int,int,std::basic_string_view<char,std::char_traits<char>>)::
            absl_log_internal_stateful_condition_state;
    if (!bVar4) {
      return;
    }
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x18e);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (&local_40,(char (*) [29])"Warning parsing text-format ");
    pcVar2 = (this->root_message_type_->all_names_).payload_;
    v_00._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v_00._M_str = pcVar2 + ~v_00._M_len;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,v_00);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,(char (*) [7])" (N = ")
    ;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar5,(uint)LVar3.counter_.super___atomic_base<unsigned_int>._M_i);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,(char (*) [4])0x5d988d)
    ;
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,message);
  }
  else {
    bVar4 = absl::lts_20250127::log_internal::LogEveryPow2State::ShouldLog
                      (&ReportWarning::absl_log_internal_stateful_condition_state);
    LVar3 = ReportWarning::absl_log_internal_stateful_condition_state;
    if (!bVar4) {
      return;
    }
    absl::lts_20250127::log_internal::LogMessage::LogMessage
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x189);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (&local_40,(char (*) [29])"Warning parsing text-format ");
    pcVar2 = (this->root_message_type_->all_names_).payload_;
    v._M_len = (ulong)*(ushort *)(pcVar2 + 2);
    v._M_str = pcVar2 + ~v._M_len;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,v);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,(char (*) [3])0x616c5f)
    ;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,line + 1);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,(char (*) [2])0x587c74)
    ;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,col + 1);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,(char (*) [7])" (N = ")
    ;
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar5,(uint)LVar3.counter_.super___atomic_base<unsigned_int>._M_i);
    pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,(char (*) [4])0x5d988d)
    ;
    absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar5,message);
  }
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_40);
  return;
}

Assistant:

void ReportWarning(int line, int col, const absl::string_view message) {
    if (error_collector_ == nullptr) {
      if (line >= 0) {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << ": " << (line + 1) << ":" << (col + 1) << " (N = " << COUNTER
            << "): " << message;
      } else {
        ABSL_LOG_EVERY_POW_2(WARNING)
            << "Warning parsing text-format " << root_message_type_->full_name()
            << " (N = " << COUNTER << "): " << message;
      }
    } else {
      error_collector_->RecordWarning(line, col, message);
    }
  }